

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O2

void __thiscall YAML::Scanner::ScanNextToken(Scanner *this)

{
  bool bVar1;
  char cVar2;
  RegEx *pRVar3;
  ParserException *this_00;
  allocator local_49;
  Mark local_48;
  string local_38;
  
  if (this->m_endedStream != false) {
    return;
  }
  if (this->m_startedStream == false) {
    StartStream(this);
    return;
  }
  ScanToNextToken(this);
  PopIndentToHere(this);
  bVar1 = YAML::Stream::operator!(&this->INPUT);
  if (bVar1) {
    EndStream(this);
    return;
  }
  if ((this->INPUT).m_mark.column == 0) {
    cVar2 = YAML::Stream::peek(&this->INPUT);
    if (cVar2 == '%') {
      ScanDirective(this);
      return;
    }
    if ((this->INPUT).m_mark.column == 0) {
      pRVar3 = Exp::DocStart();
      bVar1 = RegEx::Matches(pRVar3,&this->INPUT);
      if (bVar1) {
        ScanDocStart(this);
        return;
      }
      if ((this->INPUT).m_mark.column == 0) {
        pRVar3 = Exp::DocEnd();
        bVar1 = RegEx::Matches(pRVar3,&this->INPUT);
        if (bVar1) {
          ScanDocEnd(this);
          return;
        }
      }
    }
  }
  cVar2 = YAML::Stream::peek(&this->INPUT);
  if (cVar2 != '[') {
    cVar2 = YAML::Stream::peek(&this->INPUT);
    if (cVar2 != '{') {
      cVar2 = YAML::Stream::peek(&this->INPUT);
      if (cVar2 != ']') {
        cVar2 = YAML::Stream::peek(&this->INPUT);
        if (cVar2 != '}') {
          cVar2 = YAML::Stream::peek(&this->INPUT);
          if (cVar2 == ',') {
            ScanFlowEntry(this);
            return;
          }
          pRVar3 = Exp::BlockEntry();
          bVar1 = RegEx::Matches(pRVar3,&this->INPUT);
          if (bVar1) {
            ScanBlockEntry(this);
            return;
          }
          if ((this->m_flows).c.
              super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (this->m_flows).c.
              super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            pRVar3 = Exp::Key();
          }
          else {
            pRVar3 = Exp::KeyInFlow();
          }
          bVar1 = RegEx::Matches(pRVar3,&this->INPUT);
          if (bVar1) {
            ScanKey(this);
            return;
          }
          pRVar3 = GetValueRegex(this);
          bVar1 = RegEx::Matches(pRVar3,&this->INPUT);
          if (bVar1) {
            ScanValue(this);
            return;
          }
          cVar2 = YAML::Stream::peek(&this->INPUT);
          if (cVar2 != '*') {
            cVar2 = YAML::Stream::peek(&this->INPUT);
            if (cVar2 != '&') {
              cVar2 = YAML::Stream::peek(&this->INPUT);
              if (cVar2 == '!') {
                ScanTag(this);
                return;
              }
              if ((this->m_flows).c.
                  super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                  (this->m_flows).c.
                  super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_006a517e:
                cVar2 = YAML::Stream::peek(&this->INPUT);
                if (cVar2 != '\'') {
                  cVar2 = YAML::Stream::peek(&this->INPUT);
                  if (cVar2 != '\"') {
                    if ((this->m_flows).c.
                        super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        (this->m_flows).c.
                        super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                      pRVar3 = Exp::PlainScalar();
                    }
                    else {
                      pRVar3 = Exp::PlainScalarInFlow();
                    }
                    bVar1 = RegEx::Matches(pRVar3,&this->INPUT);
                    if (bVar1) {
                      ScanPlainScalar(this);
                      return;
                    }
                    this_00 = (ParserException *)__cxa_allocate_exception(0x40);
                    local_48.pos = (this->INPUT).m_mark.pos;
                    local_48.line = (this->INPUT).m_mark.line;
                    local_48.column = (this->INPUT).m_mark.column;
                    std::__cxx11::string::string((string *)&local_38,"unknown token",&local_49);
                    ParserException::ParserException(this_00,&local_48,&local_38);
                    __cxa_throw(this_00,&ParserException::typeinfo,BadConversion::~BadConversion);
                  }
                }
                ScanQuotedScalar(this);
                return;
              }
              cVar2 = YAML::Stream::peek(&this->INPUT);
              if (cVar2 != '|') {
                cVar2 = YAML::Stream::peek(&this->INPUT);
                if (cVar2 != '>') goto LAB_006a517e;
              }
              ScanBlockScalar(this);
              return;
            }
          }
          ScanAnchorOrAlias(this);
          return;
        }
      }
      ScanFlowEnd(this);
      return;
    }
  }
  ScanFlowStart(this);
  return;
}

Assistant:

void Scanner::ScanNextToken() {
  if (m_endedStream) {
    return;
  }

  if (!m_startedStream) {
    return StartStream();
  }

  // get rid of whitespace, etc. (in between tokens it should be irrelevant)
  ScanToNextToken();

  // maybe need to end some blocks
  PopIndentToHere();

  // *****
  // And now branch based on the next few characters!
  // *****

  // end of stream
  if (!INPUT) {
    return EndStream();
  }

  if (INPUT.column() == 0 && INPUT.peek() == Keys::Directive) {
    return ScanDirective();
  }

  // document token
  if (INPUT.column() == 0 && Exp::DocStart().Matches(INPUT)) {
    return ScanDocStart();
  }

  if (INPUT.column() == 0 && Exp::DocEnd().Matches(INPUT)) {
    return ScanDocEnd();
  }

  // flow start/end/entry
  if (INPUT.peek() == Keys::FlowSeqStart ||
      INPUT.peek() == Keys::FlowMapStart) {
    return ScanFlowStart();
  }

  if (INPUT.peek() == Keys::FlowSeqEnd || INPUT.peek() == Keys::FlowMapEnd) {
    return ScanFlowEnd();
  }

  if (INPUT.peek() == Keys::FlowEntry) {
    return ScanFlowEntry();
  }

  // block/map stuff
  if (Exp::BlockEntry().Matches(INPUT)) {
    return ScanBlockEntry();
  }

  if ((InBlockContext() ? Exp::Key() : Exp::KeyInFlow()).Matches(INPUT)) {
    return ScanKey();
  }

  if (GetValueRegex().Matches(INPUT)) {
    return ScanValue();
  }

  // alias/anchor
  if (INPUT.peek() == Keys::Alias || INPUT.peek() == Keys::Anchor) {
    return ScanAnchorOrAlias();
  }

  // tag
  if (INPUT.peek() == Keys::Tag) {
    return ScanTag();
  }

  // special scalars
  if (InBlockContext() && (INPUT.peek() == Keys::LiteralScalar ||
                           INPUT.peek() == Keys::FoldedScalar)) {
    return ScanBlockScalar();
  }

  if (INPUT.peek() == '\'' || INPUT.peek() == '\"') {
    return ScanQuotedScalar();
  }

  // plain scalars
  if ((InBlockContext() ? Exp::PlainScalar() : Exp::PlainScalarInFlow())
          .Matches(INPUT)) {
    return ScanPlainScalar();
  }

  // don't know what it is!
  throw ParserException(INPUT.mark(), ErrorMsg::UNKNOWN_TOKEN);
}